

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_resize.cpp
# Opt level: O1

void checkWindowSize(GLFWwindow *window,int width,int height,bool fatal)

{
  undefined8 in_RAX;
  ostream *poVar1;
  long *plVar2;
  char *pcVar3;
  int h;
  int w;
  undefined8 local_28;
  
  local_28 = in_RAX;
  glfwGetWindowSize(window,(int *)((long)&local_28 + 4),(int *)&local_28);
  if ((local_28._4_4_ != width) || ((int)local_28 != height)) {
    pcVar3 = "warning";
    if (fatal) {
      pcVar3 = "error";
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,pcVar3,(ulong)!fatal * 2 + 5);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,": ",2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"expected window size ",0x15);
    poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,width);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"x",1);
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,height);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,", but got ",10);
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_28._4_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"x",1);
    plVar2 = (long *)std::ostream::operator<<(poVar1,(int)local_28);
    std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
    std::ostream::put((char)plVar2);
    std::ostream::flush();
    if (fatal) {
      exit(1);
    }
  }
  return;
}

Assistant:

static void
checkWindowSize(GLFWwindow* window, int width, int height, bool fatal)
{
    int w, h;
    glfwGetWindowSize(window, &w, &h);
    if (w == width && h == height) {
        return;
    }
    std::cerr << (fatal ? "error" : "warning") << ": "
              << "expected window size " << width << "x" << height
              << ", but got " << w << "x" << h << std::endl;
    if (fatal) {
        exit(EXIT_FAILURE);
    }
}